

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O0

void __thiscall re2c::DFA::calc_stats(DFA *this)

{
  size_t sVar1;
  State *local_20;
  State *s_1;
  State *s;
  DFA *this_local;
  
  this->max_fill = 0;
  for (s_1 = this->head; s_1 != (State *)0x0; s_1 = s_1->next) {
    if (this->max_fill < s_1->fill) {
      this->max_fill = s_1->fill;
    }
  }
  sVar1 = uniq_vector_t<const_re2c::State_*>::size(&this->accepts);
  this->need_backup = sVar1 != 0;
  for (local_20 = this->head; local_20 != (State *)0x0; local_20 = local_20->next) {
    if ((local_20->isPreCtxt & 1U) != 0) {
      this->need_backupctx = true;
    }
  }
  sVar1 = uniq_vector_t<const_re2c::State_*>::size(&this->accepts);
  this->need_accept = 1 < sVar1;
  return;
}

Assistant:

void DFA::calc_stats ()
{
	// calculate 'YYMAXFILL'
	max_fill = 0;
	for (State * s = head; s; s = s->next)
	{
		if (max_fill < s->fill)
		{
			max_fill = s->fill;
		}
	}

	// determine if 'YYMARKER' or 'YYBACKUP'/'YYRESTORE' pair is used
	need_backup = accepts.size () > 0;

	// determine if 'YYCTXMARKER' or 'YYBACKUPCTX'/'YYRESTORECTX' pair is used
	for (State * s = head; s; s = s->next)
	{
		if (s->isPreCtxt)
		{
			need_backupctx = true;
		}
	}

	// determine if 'yyaccept' variable is used
	need_accept = accepts.size () > 1;
}